

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O2

shared_ptr<gui::CheckBoxStyle> __thiscall gui::DefaultTheme::makeCheckBoxStyle(DefaultTheme *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<gui::CheckBoxStyle> sVar1;
  Vector3f local_20;
  
  std::make_shared<gui::CheckBoxStyle,gui::Gui_const&>((Gui *)this);
  CheckBoxStyle::setFillColor
            ((CheckBoxStyle *)(this->super_Theme)._vptr_Theme,(Color *)&sf::Color::White);
  CheckBoxStyle::setOutlineColor
            ((CheckBoxStyle *)(this->super_Theme)._vptr_Theme,(Color *)&sf::Color::Black);
  CheckBoxStyle::setOutlineThickness((CheckBoxStyle *)(this->super_Theme)._vptr_Theme,-1.0);
  CheckBoxStyle::setFont((CheckBoxStyle *)(this->super_Theme)._vptr_Theme,*(Font **)(in_RSI + 0x48))
  ;
  CheckBoxStyle::setCharacterSize((CheckBoxStyle *)(this->super_Theme)._vptr_Theme,0xf);
  CheckBoxStyle::setTextFillColor
            ((CheckBoxStyle *)(this->super_Theme)._vptr_Theme,(Color *)&sf::Color::Black);
  CheckBoxStyle::setFillColorHover
            ((CheckBoxStyle *)(this->super_Theme)._vptr_Theme,
             (Color *)&(anonymous_namespace)::colorLightBlueTransparent);
  CheckBoxStyle::setFillColorChecked
            ((CheckBoxStyle *)(this->super_Theme)._vptr_Theme,
             (Color *)&(anonymous_namespace)::colorDarkBlue);
  local_20.z = *(float *)(in_RSI + 0x50);
  local_20.x = 8.0;
  local_20.y = 1.0;
  CheckBoxStyle::setTextPadding((CheckBoxStyle *)(this->super_Theme)._vptr_Theme,&local_20);
  sVar1.super___shared_ptr<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<gui::CheckBoxStyle>)
         sVar1.super___shared_ptr<gui::CheckBoxStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CheckBoxStyle> DefaultTheme::makeCheckBoxStyle() const {
    auto style = std::make_shared<CheckBoxStyle>(gui_);
    style->setFillColor(sf::Color::White);
    style->setOutlineColor(sf::Color::Black);
    style->setOutlineThickness(-1.0f);

    style->setFont(*font_);
    style->setCharacterSize(15);
    style->setTextFillColor(sf::Color::Black);

    style->setFillColorHover(colorLightBlueTransparent);
    style->setFillColorChecked(colorDarkBlue);
    style->setTextPadding({8.0f, 1.0f, fontMaxHeightRatio_});

    return style;
}